

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall
jpge::jpeg_encoder::compute_huffman_table
          (jpeg_encoder *this,uint *codes,uint8 *code_sizes,uint8 *bits,uint8 *val)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int l;
  long lVar8;
  uint uVar9;
  uint8 huff_size [257];
  uint huff_code [257];
  byte local_548 [272];
  uint local_438 [258];
  
  uVar9 = 0;
  lVar8 = 1;
  do {
    bVar1 = bits[lVar8];
    if ((ulong)bVar1 != 0) {
      memset(local_548 + (int)uVar9,(int)lVar8,(ulong)bVar1);
      uVar9 = uVar9 + bVar1;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x11);
  local_548[(int)uVar9] = 0;
  uVar3 = (uint)local_548[0];
  if (local_548[0] != 0) {
    iVar4 = 0;
    iVar6 = 0;
    do {
      lVar8 = (long)iVar4;
      if (uVar3 == local_548[lVar8]) {
        lVar7 = 0;
        do {
          local_438[lVar8 + lVar7] = iVar6 + (int)lVar7;
          lVar2 = lVar7 + lVar8;
          lVar7 = lVar7 + 1;
        } while (uVar3 == local_548[lVar2 + 1]);
        iVar4 = iVar4 + (int)lVar7;
        iVar6 = iVar6 + (int)lVar7;
      }
      iVar6 = iVar6 * 2;
      uVar3 = uVar3 + 1;
    } while (local_548[iVar4] != 0);
  }
  memset(codes,0,0x400);
  memset(code_sizes,0,0x100);
  if (0 < (int)uVar9) {
    uVar5 = 0;
    do {
      codes[val[uVar5]] = local_438[uVar5];
      code_sizes[val[uVar5]] = local_548[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar9 != uVar5);
  }
  return;
}

Assistant:

void jpeg_encoder::compute_huffman_table(uint* codes, uint8* code_sizes, uint8* bits, uint8* val)
	{
		int i, l, last_p, si;
		uint8 huff_size[257];
		uint huff_code[257];
		uint code;

		int p = 0;
		for (l = 1; l <= 16; l++)
			for (i = 1; i <= bits[l]; i++)
				huff_size[p++] = (char)l;

		huff_size[p] = 0; last_p = p; // write sentinel

		code = 0; si = huff_size[0]; p = 0;

		while (huff_size[p])
		{
			while (huff_size[p] == si)
				huff_code[p++] = code++;
			code <<= 1;
			si++;
		}

		memset(codes, 0, sizeof(codes[0]) * 256);
		memset(code_sizes, 0, sizeof(code_sizes[0]) * 256);
		for (p = 0; p < last_p; p++)
		{
			codes[val[p]] = huff_code[p];
			code_sizes[val[p]] = huff_size[p];
		}
	}